

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.h
# Opt level: O0

char __thiscall wasm::SourceMapReader::peek(SourceMapReader *this)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  MapParseException *this_00;
  const_reference pvVar4;
  allocator<char> local_39;
  string local_38;
  SourceMapReader *local_18;
  SourceMapReader *this_local;
  
  sVar3 = this->pos;
  local_18 = this;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->mappings);
  if (sVar3 == sVar2) {
    this_local._7_1_ = '\"';
  }
  else {
    uVar1 = this->pos;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->mappings);
    if (sVar3 < uVar1) {
      this_00 = (MapParseException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"unexpected end of source map",&local_39);
      MapParseException::MapParseException(this_00,&local_38);
      __cxa_throw(this_00,&MapParseException::typeinfo,MapParseException::~MapParseException);
    }
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       (&this->mappings,this->pos);
    this_local._7_1_ = *pvVar4;
  }
  return this_local._7_1_;
}

Assistant:

char peek() {
    if (pos == mappings.size()) {
      return '"';
    } else if (pos > mappings.size()) {
      throw MapParseException("unexpected end of source map");
    }
    return mappings[pos];
  }